

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O2

void __thiscall VDasher::lineTo(VDasher *this,VPointF *p)

{
  VPointF *p_00;
  float fVar1;
  float lengthAt;
  VLine right;
  VLine left;
  VPointF local_70;
  VPointF local_68;
  VPointF VStack_60;
  VPointF local_58;
  VPointF VStack_50;
  undefined1 local_48 [8];
  VPointF VStack_40;
  
  local_48._0_4_ = 0.0;
  local_48._4_4_ = 0.0;
  VStack_40.mx = 0.0;
  VStack_40.my = 0.0;
  local_58.mx = 0.0;
  local_58.my = 0.0;
  VStack_50.mx = 0.0;
  VStack_50.my = 0.0;
  local_68 = this->mCurPt;
  VStack_60 = *p;
  fVar1 = VLine::length((VLine *)&local_68);
  lengthAt = this->mCurrentLength;
  if (fVar1 <= lengthAt) {
    this->mCurrentLength = lengthAt - fVar1;
    p_00 = p;
  }
  else {
    while (lengthAt < fVar1) {
      fVar1 = fVar1 - lengthAt;
      VLine::splitAtLength((VLine *)&local_68,lengthAt,(VLine *)local_48,(VLine *)&local_58);
      local_70 = VStack_40;
      addLine(this,&local_70);
      updateActiveSegment(this);
      local_68 = local_58;
      VStack_60 = VStack_50;
      this->mCurPt = local_58;
      lengthAt = this->mCurrentLength;
    }
    if (fVar1 <= 0.1) goto LAB_0010aea9;
    this->mCurrentLength = lengthAt - fVar1;
    local_70 = VStack_60;
    p_00 = &local_70;
  }
  addLine(this,p_00);
  lengthAt = this->mCurrentLength;
LAB_0010aea9:
  if (lengthAt < 0.1) {
    updateActiveSegment(this);
  }
  this->mCurPt = *p;
  return;
}

Assistant:

void VDasher::lineTo(const VPointF &p)
{
    VLine left, right;
    VLine line(mCurPt, p);
    float length = line.length();

    if (length <= mCurrentLength) {
        mCurrentLength -= length;
        addLine(p);
    } else {
        while (length > mCurrentLength) {
            length -= mCurrentLength;
            line.splitAtLength(mCurrentLength, left, right);

            addLine(left.p2());
            updateActiveSegment();

            line = right;
            mCurPt = line.p1();
        }
        // handle remainder
        if (length > tolerance) {
            mCurrentLength -= length;
            addLine(line.p2());
        }
    }

    if (mCurrentLength < tolerance) updateActiveSegment();

    mCurPt = p;
}